

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O2

bool __thiscall ON_BrepFaceArray::Read(ON_BrepFaceArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ON_BrepFace *pOVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  bool bHavePerFaceColors;
  int count;
  ON_Color per_face_color;
  int minor_version;
  int major_version;
  ON__UINT32 tcode;
  long local_40;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  
  ON_ClassArray<ON_BrepFace>::Empty((ON_ClassArray<ON_BrepFace> *)this);
  tcode = 0;
  length_TCODE_ANONYMOUS_CHUNK = 0;
  count = 0;
  major_version = 0;
  minor_version = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(file,&tcode,&length_TCODE_ANONYMOUS_CHUNK);
  if (!bVar1) {
    return false;
  }
  if (tcode == 0x40008000) {
    bVar2 = ON_BinaryArchive::Read3dmChunkVersion(file,&major_version,&minor_version);
    bVar1 = false;
    if ((!bVar2) || (bVar1 = false, major_version != 1)) goto LAB_0042d583;
    bVar1 = ON_BinaryArchive::ReadInt(file,&count);
    uVar3 = (uint)bVar1;
    ON_ClassArray<ON_BrepFace>::SetCapacity((ON_ClassArray<ON_BrepFace> *)this,(long)count);
    for (iVar7 = 0; ((uVar3 & 1) != 0 && (iVar7 < count)); iVar7 = iVar7 + 1) {
      pOVar5 = ON_ClassArray<ON_BrepFace>::AppendNew((ON_ClassArray<ON_BrepFace> *)this);
      uVar3 = (*(pOVar5->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
                _vptr_ON_Object[0xb])(pOVar5,file);
    }
    bVar1 = (bool)((byte)uVar3 & 1);
    if (minor_version < 1) goto LAB_0042d583;
    lVar8 = 0x54;
    lVar6 = 0;
    while ((lVar6 < count && (bVar1 != false))) {
      bVar1 = ON_BinaryArchive::ReadUuid
                        (file,(ON_UUID *)
                              ((((this->super_ON_ObjectArray<ON_BrepFace>).
                                 super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                              lVar8 + -0x5c));
      lVar6 = lVar6 + 1;
      lVar8 = lVar8 + 0xd8;
    }
    if ((bVar1 == false) || (minor_version < 2)) goto LAB_0042d583;
    bHavePerFaceColors = false;
    bVar1 = ON_BinaryArchive::ReadBool(file,&bHavePerFaceColors);
    if (bVar1) {
      bVar1 = true;
      if (bHavePerFaceColors == true) {
        bVar1 = true;
        lVar8 = 0;
        for (lVar6 = 0; (bVar1 != false && (lVar6 < count)); lVar6 = lVar6 + 1) {
          per_face_color = ON_Color::UnsetColor;
          bVar1 = ON_BinaryArchive::ReadColor(file,&per_face_color);
          if (bVar1) {
            uVar3 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
            local_40 = lVar8;
            uVar4 = ON_Color::operator_cast_to_unsigned_int(&per_face_color);
            lVar8 = local_40;
            if (uVar3 != uVar4) {
              ON_BrepFace::SetPerFaceColor
                        ((ON_BrepFace *)
                         ((((this->super_ON_ObjectArray<ON_BrepFace>).
                            super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                         local_40 + -0x5c),per_face_color);
            }
          }
          lVar8 = lVar8 + 0xd8;
        }
      }
      goto LAB_0042d583;
    }
  }
  bVar1 = false;
LAB_0042d583:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_BrepFaceArray::Read( ON_BinaryArchive& file )
{
  Empty();
  ON__UINT32 tcode = 0;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
  int count = 0;
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
  if (rc) {
    if (tcode != TCODE_ANONYMOUS_CHUNK)
      rc = false;
    if (rc) rc = file.Read3dmChunkVersion(&major_version,&minor_version);
    if (rc) {
      if ( major_version==1 ) 
      {
        if (rc) rc = file.ReadInt(&count);
        SetCapacity(count);
        for ( i = 0; i < count && rc ; i++ ) 
        {
          ON_BrepFace& face = AppendNew();
          rc = face.Read(file)?true:false;
        }    

        if ( minor_version >= 1 )
        {
          // chunk version 1.1 and later has face uuids
          for ( i = 0; i < count && rc; i++ )
          {
            rc = file.ReadUuid( m_a[i].m_face_uuid );
          }

          if (rc && minor_version >= 2)
          {
            // chunk version 1.2 and later has per face colors
            bool bHavePerFaceColors = false;
            rc = file.ReadBool(&bHavePerFaceColors);
            if (rc && bHavePerFaceColors)
            {
              for (i = 0; rc && i < count; i++)
              {
                ON_Color per_face_color = ON_Color::UnsetColor;
                rc = file.ReadColor(per_face_color);
                if (rc && ON_Color::UnsetColor != per_face_color)
                  m_a[i].SetPerFaceColor(per_face_color);
              }
            }
          }
        }
      }
      else 
      {
        rc = 0;
      }
    }
    if ( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}